

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfdrivr.c
# Opt level: O2

FT_Error pcf_cmap_init(FT_CMap pcfcmap,FT_Pointer init_data)

{
  FT_Face pFVar1;
  
  pFVar1 = (pcfcmap->charmap).face;
  pcfcmap[1].charmap.face = (FT_Face)pFVar1[2].family_name;
  *(FT_String **)&pcfcmap[1].charmap.encoding = pFVar1[2].style_name;
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  pcf_cmap_init( FT_CMap     pcfcmap,   /* PCF_CMap */
                 FT_Pointer  init_data )
  {
    PCF_CMap  cmap = (PCF_CMap)pcfcmap;
    PCF_Face  face = (PCF_Face)FT_CMAP_FACE( pcfcmap );

    FT_UNUSED( init_data );


    cmap->num_encodings = face->nencodings;
    cmap->encodings     = face->encodings;

    return FT_Err_Ok;
  }